

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::CreateSortKeyBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  pointer *ppOVar1;
  PhysicalType type;
  iterator __position;
  byte bVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  bool bVar5;
  int iVar6;
  reference pvVar7;
  pointer pEVar8;
  type expr;
  pointer pCVar9;
  reference this_00;
  idx_t iVar10;
  BinderException *pBVar11;
  pointer puVar12;
  ulong uVar13;
  size_type sVar14;
  pointer puVar15;
  string sort_specifier_str;
  Value sort_specifier;
  OrderModifiers local_ca;
  _Head_base<0UL,_duckdb::CreateSortKeyBindData_*,_false> local_c8;
  string local_c0;
  ScalarFunction *local_a0;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_98;
  Value local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  puVar15 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar12 = (arguments->
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ).
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = bound_function;
  local_98._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if (((long)puVar12 - (long)puVar15 & 8U) != 0) {
    pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
    local_90.type_._0_8_ =
         &local_90.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,
               "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]"
               ,"");
    BinderException::BinderException(pBVar11,(string *)&local_90);
    __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_c8._M_head_impl = (CreateSortKeyBindData *)operator_new(0x20);
  ((local_c8._M_head_impl)->super_FunctionData)._vptr_FunctionData =
       (_func_int **)&PTR__CreateSortKeyBindData_01988208;
  ((local_c8._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_c8._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_c8._M_head_impl)->modifiers).
  super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
  super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (8 < (ulong)((long)puVar12 - (long)puVar15)) {
    sVar14 = 1;
    do {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar7);
      iVar6 = (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar8);
      if ((char)iVar6 == '\0') {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_90.type_._0_8_ =
             &local_90.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"sort_specifier must be a constant value - but got %s","");
        pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,sVar14);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar7);
        (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[8])(&local_50,pEVar8);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar11,(string *)&local_90,&local_50);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar7);
      ExpressionExecutor::EvaluateScalar(&local_90,context,expr,false);
      if (local_90.is_null == true) {
        pBVar11 = (BinderException *)__cxa_allocate_exception(0x10);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"sort_specifier cannot be NULL","");
        BinderException::BinderException(pBVar11,&local_c0);
        __cxa_throw(pBVar11,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      Value::ToString_abi_cxx11_(&local_c0,&local_90);
      pCVar9 = unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
               ::operator->((unique_ptr<duckdb::CreateSortKeyBindData,_std::default_delete<duckdb::CreateSortKeyBindData>,_true>
                             *)&local_c8);
      local_ca = OrderModifiers::Parse(&local_c0);
      __position._M_current =
           (pCVar9->modifiers).
           super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
           super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pCVar9->modifiers).
          super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
          super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::
        _M_realloc_insert<duckdb::OrderModifiers>
                  (&(pCVar9->modifiers).
                    super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>,
                   __position,&local_ca);
      }
      else {
        *__position._M_current = local_ca;
        ppOVar1 = &(pCVar9->modifiers).
                   super_vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
                   super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppOVar1 = *ppOVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      Value::~Value(&local_90);
      sVar14 = sVar14 + 2;
      puVar15 = (arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (sVar14 < (ulong)((long)puVar12 - (long)puVar15 >> 3));
  }
  if (puVar12 != puVar15) {
    sVar14 = 0;
    do {
      pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,sVar14);
      this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator[](arguments,sVar14);
      pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_00);
      ExpressionBinder::PushCollation(context,pvVar7,&pEVar8->return_type,ALL_COLLATIONS);
      sVar14 = sVar14 + 2;
      puVar15 = (arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar12 = (arguments->
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ).
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (sVar14 < (ulong)((long)puVar12 - (long)puVar15 >> 3));
    if (puVar12 != puVar15) {
      bVar2 = 1;
      sVar14 = 0;
      uVar13 = 0;
      do {
        pvVar7 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::operator[](arguments,sVar14);
        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar7);
        type = (pEVar8->return_type).physical_type_;
        bVar5 = TypeIsConstantSize(type);
        if (bVar5) {
          iVar10 = GetTypeIdSize(type);
          uVar13 = uVar13 + iVar10 + 1;
        }
        else {
          bVar2 = 0;
        }
        sVar14 = sVar14 + 2;
      } while (sVar14 < (ulong)((long)(arguments->
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(arguments->
                                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
      if (!(bool)(bVar2 & uVar13 < 9)) goto LAB_00a12ff7;
    }
  }
  LogicalType::LogicalType(&local_90.type_,BIGINT);
  (local_a0->super_BaseScalarFunction).return_type.id_ = local_90.type_.id_;
  (local_a0->super_BaseScalarFunction).return_type.physical_type_ = local_90.type_.physical_type_;
  peVar3 = (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_90.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (local_a0->super_BaseScalarFunction).return_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_90.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_90.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  local_90.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  LogicalType::~LogicalType(&local_90.type_);
LAB_00a12ff7:
  *(CreateSortKeyBindData **)
   local_98._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = local_c8._M_head_impl;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_98._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> CreateSortKeyBind(ClientContext &context, ScalarFunction &bound_function,
                                           vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() % 2 != 0) {
		throw BinderException(
		    "Arguments to create_sort_key must be [key1, sort_specifier1, key2, sort_specifier2, ...]");
	}
	auto result = make_uniq<CreateSortKeyBindData>();
	for (idx_t i = 1; i < arguments.size(); i += 2) {
		if (!arguments[i]->IsFoldable()) {
			throw BinderException("sort_specifier must be a constant value - but got %s", arguments[i]->ToString());
		}

		// Rebind to return a date if we are truncating that far
		Value sort_specifier = ExpressionExecutor::EvaluateScalar(context, *arguments[i]);
		if (sort_specifier.IsNull()) {
			throw BinderException("sort_specifier cannot be NULL");
		}
		auto sort_specifier_str = sort_specifier.ToString();
		result->modifiers.push_back(OrderModifiers::Parse(sort_specifier_str));
	}
	// push collations
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		ExpressionBinder::PushCollation(context, arguments[i], arguments[i]->return_type);
	}
	// check if all types are constant
	bool all_constant = true;
	idx_t constant_size = 0;
	for (idx_t i = 0; i < arguments.size(); i += 2) {
		auto physical_type = arguments[i]->return_type.InternalType();
		if (!TypeIsConstantSize(physical_type)) {
			all_constant = false;
		} else {
			// we always add one byte for the validity
			constant_size += GetTypeIdSize(physical_type) + 1;
		}
	}
	if (all_constant) {
		if (constant_size <= sizeof(int64_t)) {
			bound_function.return_type = LogicalType::BIGINT;
		}
	}
	return std::move(result);
}